

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDenseNetwork.cpp
# Opt level: O0

IDenseNetwork * __thiscall
IDenseNetworkBuilder::Build
          (IDenseNetworkBuilder *this,vector<LayerMeta,_std::allocator<LayerMeta>_> *layersMeta,
          ISynapseBuilder *synapseBuilder,ILayerBuilder *layerBuilder,IEventManager *eventManager,
          default_random_engine *generator,float induceDistLimit)

{
  value_type pIVar1;
  int iVar2;
  size_type sVar3;
  ulong uVar4;
  const_reference pvVar5;
  undefined4 extraout_var;
  reference ppIVar6;
  IDenseNetwork *this_00;
  float fVar7;
  pair<unsigned_long,_unsigned_long> pVar8;
  size_t local_130;
  vector<ILayer_*,_std::allocator<ILayer_*>_> local_e8;
  unsigned_long local_d0;
  pair<unsigned_long,_unsigned_long> sConnectionsInfo;
  size_t nextLayerSize;
  size_t ldx_1;
  undefined1 local_a8 [4];
  float zShift;
  int local_68;
  int ldx;
  undefined1 local_58 [8];
  vector<ILayer_*,_std::allocator<ILayer_*>_> layers;
  float squaredDistLimit;
  float induceDistLimit_local;
  default_random_engine *generator_local;
  IEventManager *eventManager_local;
  ILayerBuilder *layerBuilder_local;
  ISynapseBuilder *synapseBuilder_local;
  vector<LayerMeta,_std::allocator<LayerMeta>_> *layersMeta_local;
  IDenseNetworkBuilder *this_local;
  
  layers.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = induceDistLimit * induceDistLimit;
  layers.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = induceDistLimit;
  std::vector<ILayer_*,_std::allocator<ILayer_*>_>::vector
            ((vector<ILayer_*,_std::allocator<ILayer_*>_> *)local_58);
  sVar3 = std::vector<LayerMeta,_std::allocator<LayerMeta>_>::size(layersMeta);
  std::vector<ILayer_*,_std::allocator<ILayer_*>_>::resize
            ((vector<ILayer_*,_std::allocator<ILayer_*>_> *)local_58,sVar3);
  local_68 = 0;
  while( true ) {
    uVar4 = (ulong)local_68;
    sVar3 = std::vector<LayerMeta,_std::allocator<LayerMeta>_>::size(layersMeta);
    if (sVar3 <= uVar4) break;
    pvVar5 = std::vector<LayerMeta,_std::allocator<LayerMeta>_>::operator[]
                       (layersMeta,(long)local_68);
    LayerMeta::LayerMeta((LayerMeta *)local_a8,pvVar5);
    iVar2 = (**layerBuilder->_vptr_ILayerBuilder)(layerBuilder,local_a8);
    ppIVar6 = std::vector<ILayer_*,_std::allocator<ILayer_*>_>::operator[]
                        ((vector<ILayer_*,_std::allocator<ILayer_*>_> *)local_58,(long)local_68);
    *ppIVar6 = (value_type)CONCAT44(extraout_var,iVar2);
    LayerMeta::~LayerMeta((LayerMeta *)local_a8);
    local_68 = local_68 + 1;
  }
  ldx_1._4_4_ = 0.0;
  nextLayerSize = 0;
  while( true ) {
    sVar3 = std::vector<ILayer_*,_std::allocator<ILayer_*>_>::size
                      ((vector<ILayer_*,_std::allocator<ILayer_*>_> *)local_58);
    if (sVar3 <= nextLayerSize) break;
    sVar3 = std::vector<ILayer_*,_std::allocator<ILayer_*>_>::size
                      ((vector<ILayer_*,_std::allocator<ILayer_*>_> *)local_58);
    if (nextLayerSize + 1 < sVar3) {
      ppIVar6 = std::vector<ILayer_*,_std::allocator<ILayer_*>_>::operator[]
                          ((vector<ILayer_*,_std::allocator<ILayer_*>_> *)local_58,nextLayerSize + 1
                          );
      local_130 = ILayer::GetSize(*ppIVar6);
    }
    else {
      local_130 = 0;
    }
    sConnectionsInfo.second = local_130;
    ppIVar6 = std::vector<ILayer_*,_std::allocator<ILayer_*>_>::operator[]
                        ((vector<ILayer_*,_std::allocator<ILayer_*>_> *)local_58,nextLayerSize);
    fVar7 = ILayer::GetZShift(*ppIVar6);
    ldx_1._4_4_ = ldx_1._4_4_ + fVar7;
    ppIVar6 = std::vector<ILayer_*,_std::allocator<ILayer_*>_>::operator[]
                        ((vector<ILayer_*,_std::allocator<ILayer_*>_> *)local_58,nextLayerSize);
    (*(*ppIVar6)->_vptr_ILayer[2])(ldx_1._4_4_,*ppIVar6,sConnectionsInfo.second,generator);
    if (sConnectionsInfo.second != 0) {
      ppIVar6 = std::vector<ILayer_*,_std::allocator<ILayer_*>_>::operator[]
                          ((vector<ILayer_*,_std::allocator<ILayer_*>_> *)local_58,nextLayerSize);
      pIVar1 = *ppIVar6;
      ppIVar6 = std::vector<ILayer_*,_std::allocator<ILayer_*>_>::operator[]
                          ((vector<ILayer_*,_std::allocator<ILayer_*>_> *)local_58,nextLayerSize + 1
                          );
      (*pIVar1->_vptr_ILayer[0xb])(pIVar1,*ppIVar6,synapseBuilder);
    }
    nextLayerSize = nextLayerSize + 1;
  }
  pVar8 = BuildSpatialConnections
                    ((vector<ILayer_*,_std::allocator<ILayer_*>_> *)local_58,
                     layers.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._0_4_);
  sConnectionsInfo.first = pVar8.second;
  local_d0 = pVar8.first;
  this_00 = (IDenseNetwork *)operator_new(0x30);
  std::vector<ILayer_*,_std::allocator<ILayer_*>_>::vector
            (&local_e8,(vector<ILayer_*,_std::allocator<ILayer_*>_> *)local_58);
  IDenseNetwork::IDenseNetwork(this_00,&local_e8,eventManager,local_d0,sConnectionsInfo.first);
  std::vector<ILayer_*,_std::allocator<ILayer_*>_>::~vector(&local_e8);
  std::vector<ILayer_*,_std::allocator<ILayer_*>_>::~vector
            ((vector<ILayer_*,_std::allocator<ILayer_*>_> *)local_58);
  return this_00;
}

Assistant:

IDenseNetwork *
IDenseNetworkBuilder::Build( const std::vector<LayerMeta> &layersMeta, const ISynapseBuilder &synapseBuilder,
                             const ILayerBuilder &layerBuilder, IEventManager &eventManager,
                             std::default_random_engine &generator, float induceDistLimit ) const
{
    float squaredDistLimit = induceDistLimit * induceDistLimit;
    std::vector<ILayer *> layers;
    layers.resize( layersMeta.size());
    for ( int ldx = 0; ldx < layersMeta.size(); ++ldx ) {
        layers[ldx] = layerBuilder.Build( layersMeta[ldx] );
    }
    float zShift = 0;

    for ( size_t ldx = 0; ldx < layers.size(); ++ldx ) {
        size_t nextLayerSize = ldx + 1 < layers.size() ? layers[ldx + 1]->GetSize() : 0;
        zShift += layers[ldx]->GetZShift();
        layers[ldx]->Init( nextLayerSize, generator, zShift );
        if ( nextLayerSize ) {
            layers[ldx]->BindWithNext( *layers[ldx + 1], synapseBuilder );
        }
    }
    auto sConnectionsInfo = BuildSpatialConnections( layers, squaredDistLimit );
    return new IDenseNetwork( layers, eventManager, sConnectionsInfo.first, sConnectionsInfo.second );
}